

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

void Fl::option(Fl_Option opt,bool val)

{
  if (opt < OPTION_LAST) {
    if (options_read_ == '\0') {
      option(opt);
    }
    options_[opt] = val;
  }
  return;
}

Assistant:

void Fl::option(Fl_Option opt, bool val)
{
  if (opt<0 || opt>=OPTION_LAST)
    return;
  if (!options_read_) {
    // first read this option, so we don't override our setting later
    option(opt);
  }
  options_[opt] = val;
}